

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_clp__add_options(fct_clp_t *clp,fctcl_init_t *options)

{
  fctcl_t *itm;
  fctcl_t *cpy;
  fctcl_init_t *pfStack_20;
  int ok;
  fctcl_init_t *pclo;
  fctcl_init_t *options_local;
  fct_clp_t *clp_local;
  
  pfStack_20 = options;
  while( true ) {
    if (pfStack_20->action == FCTCL_STORE_UNDEFINED) {
      return 1;
    }
    itm = fctcl_new2(pfStack_20);
    if (itm == (fctcl_t *)0x0) break;
    fct_nlist__append(&clp->clo_list,itm);
    pfStack_20 = pfStack_20 + 1;
  }
  return 0;
}

Assistant:

static int
fct_clp__add_options(fct_clp_t *clp, fctcl_init_t const *options)
{
    fctcl_init_t const *pclo =NULL;
    int ok;
    for ( pclo = options; pclo->action != FCTCL_STORE_UNDEFINED; ++pclo )
    {
        fctcl_t *cpy = fctcl_new2(pclo);
        if ( cpy == NULL )
        {
            ok = 0;
            goto finally;
        }
        fct_nlist__append(&(clp->clo_list), (void*)cpy);
    }
    ok =1;
finally:
    return ok;
}